

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::clear(Blip_Buffer *this,int entire_buffer)

{
  int in_ESI;
  Blip_Buffer *in_RDI;
  long count;
  long local_28;
  
  in_RDI->offset_ = 0;
  in_RDI->reader_accum_ = 0;
  in_RDI->modified_ = 0;
  if (in_RDI->buffer_ != (buf_t_ *)0x0) {
    if (in_ESI == 0) {
      local_28 = samples_avail(in_RDI);
    }
    else {
      local_28 = (long)in_RDI->buffer_size_;
    }
    memset(in_RDI->buffer_,0,(local_28 + 0x12) * 4);
  }
  return;
}

Assistant:

void Blip_Buffer::clear( int entire_buffer )
{
	offset_      = 0;
	reader_accum_ = 0;
	modified_    = 0;
	if ( buffer_ )
	{
		long count = (entire_buffer ? buffer_size_ : samples_avail());
		memset( buffer_, 0, (count + blip_buffer_extra_) * sizeof (buf_t_) );
	}
}